

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_textedit_find_charpos
               (nk_text_find *find,nk_text_edit *state,int n,int single_line,nk_user_font *font,
               float row_height)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  nk_text_edit *in_RDI;
  float fVar2;
  nk_text_edit_row *unaff_retaddr;
  int first;
  int i;
  int z;
  int prev_start;
  nk_text_edit_row r;
  nk_size in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar3;
  int line_start;
  int iVar4;
  int in_stack_ffffffffffffffc4;
  int local_38;
  float local_34;
  float local_30;
  float local_2c;
  int local_28;
  undefined4 uVar5;
  
  iVar4 = 0;
  line_start = *(int *)(in_RSI + 0x90);
  iVar3 = 0;
  nk_zero((void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
          in_stack_ffffffffffffffa8);
  if (in_EDX == line_start) {
    nk_textedit_layout_row
              (unaff_retaddr,in_RDI,(int)((ulong)in_RSI >> 0x20),(float)in_RSI,
               (nk_user_font *)CONCAT44(in_EDX,in_ECX));
    if (in_ECX == 0) {
      uVar5 = 0;
      while (iVar3 < line_start) {
        iVar1 = local_28 + iVar3;
        iVar4 = iVar3;
        nk_textedit_layout_row
                  (unaff_retaddr,in_RDI,(int)((ulong)in_RSI >> 0x20),(float)in_RSI,
                   (nk_user_font *)CONCAT44(in_EDX,uVar5));
        iVar3 = iVar1;
      }
      *(int *)((long)&(in_RDI->clip).paste + 4) = iVar3;
      *(int *)&(in_RDI->clip).copy = local_28;
    }
    else {
      *(undefined4 *)((long)&(in_RDI->clip).paste + 4) = 0;
      *(int *)&(in_RDI->clip).copy = line_start;
    }
    (in_RDI->clip).userdata.id = local_38;
    *(float *)((long)&(in_RDI->clip).userdata + 4) = local_30;
    *(float *)&(in_RDI->clip).paste = local_2c - local_30;
    *(int *)((long)&(in_RDI->clip).copy + 4) = iVar4;
  }
  else {
    *(undefined4 *)((long)&(in_RDI->clip).userdata + 4) = 0;
    while( true ) {
      iVar1 = iVar3;
      nk_textedit_layout_row
                (unaff_retaddr,in_RDI,(int)((ulong)in_RSI >> 0x20),(float)in_RSI,
                 (nk_user_font *)CONCAT44(in_EDX,in_ECX));
      if (in_EDX < iVar1 + local_28) break;
      *(float *)((long)&(in_RDI->clip).userdata + 4) =
           local_34 + *(float *)((long)&(in_RDI->clip).userdata + 4);
      iVar3 = local_28 + iVar1;
      iVar4 = iVar1;
    }
    *(int *)((long)&(in_RDI->clip).paste + 4) = iVar1;
    *(int *)&(in_RDI->clip).copy = local_28;
    *(float *)&(in_RDI->clip).paste = local_2c - local_30;
    *(int *)((long)&(in_RDI->clip).copy + 4) = iVar4;
    (in_RDI->clip).userdata.id = in_stack_ffffffffffffffc4;
    for (iVar3 = 0; iVar1 + iVar3 < in_EDX; iVar3 = iVar3 + 1) {
      fVar2 = nk_textedit_get_width
                        ((nk_text_edit *)CONCAT44(in_stack_ffffffffffffffc4,iVar4),line_start,iVar3,
                         (nk_user_font *)CONCAT44(iVar1,in_stack_ffffffffffffffb0));
      *(float *)&(in_RDI->clip).userdata = fVar2 + *(float *)&(in_RDI->clip).userdata;
    }
  }
  return;
}

Assistant:

NK_INTERN void
nk_textedit_find_charpos(struct nk_text_find *find, struct nk_text_edit *state,
int n, int single_line, const struct nk_user_font *font, float row_height)
{
/* find the x/y location of a character, and remember info about the previous
     * row in case we get a move-up event (for page up, we'll have to rescan) */
struct nk_text_edit_row r;
int prev_start = 0;
int z = state->string.len;
int i=0, first;

nk_zero_struct(r);
if (n == z) {
/* if it's at the end, then find the last line -- simpler than trying to
        explicitly handle this case in the regular code */
nk_textedit_layout_row(&r, state, 0, row_height, font);
if (single_line) {
find->first_char = 0;
find->length = z;
} else {
while (i < z) {
prev_start = i;
i += r.num_chars;
nk_textedit_layout_row(&r, state, i, row_height, font);
}

find->first_char = i;
find->length = r.num_chars;
}
find->x = r.x1;
find->y = r.ymin;
find->height = r.ymax - r.ymin;
find->prev_first = prev_start;
return;
}

/* search rows to find the one that straddles character n */
find->y = 0;

for(;;) {
nk_textedit_layout_row(&r, state, i, row_height, font);
if (n < i + r.num_chars) break;
prev_start = i;
i += r.num_chars;
find->y += r.baseline_y_delta;
}

find->first_char = first = i;
find->length = r.num_chars;
find->height = r.ymax - r.ymin;
find->prev_first = prev_start;

/* now scan to find xpos */
find->x = r.x0;
for (i=0; first+i < n; ++i)
find->x += nk_textedit_get_width(state, first, i, font);
}